

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O2

int __thiscall FirewirePort::NumberOfUsers(FirewirePort *this)

{
  int iVar1;
  FILE *pFVar2;
  ostream *poVar3;
  char *pcVar4;
  uint uVar5;
  string result;
  char command [256];
  char path [512];
  undefined1 *local_358;
  undefined8 local_350;
  undefined1 local_348 [16];
  char local_338 [256];
  char local_238 [520];
  
  uVar5 = 0;
  sprintf(local_338,"lsof -t /dev/fw%d 2> /dev/null",(ulong)(uint)(this->super_BasePort).PortNum);
  pFVar2 = popen(local_338,"r");
  if (pFVar2 == (FILE *)0x0) {
    poVar3 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->super_BasePort).PortNum);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  local_358 = local_348;
  local_350 = 0;
  local_348[0] = 0;
  while( true ) {
    pcVar4 = fgets(local_238,0x200,pFVar2);
    if (pcVar4 == (char *)0x0) break;
    std::__cxx11::string::append((char *)&local_358);
    uVar5 = uVar5 + 1;
  }
  iVar1 = pclose(pFVar2);
  if (iVar1 == -1) {
    poVar3 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::NumberOfUsers: error in pclose after lsof call");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if (2 < uVar5) {
    sprintf(local_338,"lsof -R /dev/fw%d 2> /dev/null",(ulong)(uint)(this->super_BasePort).PortNum);
    pFVar2 = popen(local_338,"r");
    if (pFVar2 == (FILE *)0x0) {
      poVar3 = std::operator<<((this->super_BasePort).outStr,
                               "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port "
                              );
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->super_BasePort).PortNum);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::__cxx11::string::assign((char *)&local_358);
    while( true ) {
      pcVar4 = fgets(local_238,0x200,pFVar2);
      if (pcVar4 == (char *)0x0) break;
      std::__cxx11::string::append((char *)&local_358);
    }
    pclose(pFVar2);
    poVar3 = std::operator<<((this->super_BasePort).outStr,"FirewirePort::NumberOfUsers: found ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5 - 1);
    poVar3 = std::operator<<(poVar3," users");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"Full lsof result:");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,(string *)&local_358);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&local_358);
  return uVar5 - 1;
}

Assistant:

int FirewirePort::NumberOfUsers(void)
{
    // try to count of many users on the handle
    char command[256];
    sprintf(command, "lsof -t /dev/fw%d 2> /dev/null", PortNum);
    FILE * fp;
    int status;
    char path[512];
    fp = popen(command, "r");
    if (fp == NULL) {
        outStr << "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port " << PortNum << std::endl;
    }
    std::string result;
    int numberOfLines = 0;
    while (fgets(path, 512, fp) != NULL) {
        result.append(path);
        numberOfLines++;
    }
    status = pclose(fp);

    if (status == -1) {
        outStr << "FirewirePort::NumberOfUsers: error in pclose after lsof call" << std::endl;
    }
    int numberOfUsers = numberOfLines - 1; // lsof itself
    if (numberOfUsers > 1) {
        sprintf(command, "lsof -R /dev/fw%d 2> /dev/null", PortNum);
        fp = popen(command, "r");
        if (fp == NULL) {
            outStr << "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port " << PortNum << std::endl;
        }
        result = "";   // clear result
        while (fgets(path, 512, fp) != NULL) {
            result.append(path);
        }
        status = pclose(fp);

        outStr << "FirewirePort::NumberOfUsers: found " << numberOfUsers << " users" << std::endl
               << "Full lsof result:" << std::endl
               << result << std::endl;
    }
    return numberOfUsers;
}